

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O1

void __thiscall GcHeap::GcHeapImpl::Collect(GcHeapImpl *this)

{
  size_t *psVar1;
  uint8_t *puVar2;
  Sexp *this_00;
  mapped_type pSVar3;
  _List_node_base *p_Var4;
  pointer ppSVar5;
  mapped_type *ppSVar6;
  _List_node_base *p_Var7;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Hashtable<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  if (this->heap_verify == true) {
    VerifyHeap(this);
  }
  this->gc_number = this->gc_number + 1;
  DebugLog("[%d] beginning a GC");
  if ((this->forwarding_addresses)._M_h._M_element_count != 0) {
    __assert_fail("forwarding_addresses.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                  ,0xe5,"void GcHeap::GcHeapImpl::Collect()");
  }
  if ((this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("worklist.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                  ,0xe6,"void GcHeap::GcHeapImpl::Collect()");
  }
  puVar2 = this->fromspace;
  this->fromspace = this->tospace;
  this->tospace = puVar2;
  this->top = puVar2 + this->extent;
  this->free = puVar2;
  DebugLog("[%d] processing roots",this->gc_number);
  ScanRoots<GcHeap::GcHeapImpl::Collect()::_lambda(Sexp**)_1_>((anon_class_8_1_8991fb9c)this);
  DebugLog("[%d] draining worklist",this->gc_number);
  ppSVar5 = (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppSVar5) {
    do {
      this_00 = ppSVar5[-1];
      (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppSVar5 + -1;
      local_58._8_8_ = 0;
      pcStack_40 = std::
                   _Function_handler<void_(Sexp_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp:246:26)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(Sexp_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp:246:26)>
                 ::_M_manager;
      local_58._M_unused._M_object = this;
      Sexp::TracePointers(this_00,(function<void_(Sexp_**)> *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      ppSVar5 = (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while ((this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
             super__Vector_impl_data._M_start != ppSVar5);
  }
  local_38 = &(this->forwarding_addresses)._M_h;
  DebugLog("[%d] finalizing dead objects",this->gc_number);
  std::__cxx11::list<Sexp*,std::allocator<Sexp*>>::
  remove_if<GcHeap::GcHeapImpl::Collect()::_lambda(Sexp*)_1_>
            ((list<Sexp*,std::allocator<Sexp*>> *)&this->finalize_queue,
             (anon_class_8_1_8991fb9c)this);
  DebugLog("[%d] updating pointers in finalizer queue",this->gc_number);
  p_Var7 = (this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while( true ) {
    if (p_Var7 == (_List_node_base *)&this->finalize_queue) {
      DebugLog("[%d] GC complete",this->gc_number);
      std::
      _Hashtable<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(local_38);
      ppSVar5 = (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppSVar5) {
        (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppSVar5;
      }
      if (this->heap_verify != false) {
        VerifyHeap(this);
      }
      return;
    }
    ppSVar6 = std::__detail::
              _Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<Sexp_*,_std::pair<Sexp_*const,_Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>,_std::__detail::_Select1st,_std::equal_to<Sexp_*>,_std::hash<Sexp_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)local_38,(key_type *)(p_Var7 + 1));
    pSVar3 = *ppSVar6;
    if (pSVar3 == (mapped_type)0x0) break;
    DebugLog("[%d] finalizer queue relocation: %p -> %p",this->gc_number,p_Var7[1]._M_next,pSVar3);
    p_Var4 = p_Var7->_M_next;
    psVar1 = &(this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var7,0x18);
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pSVar3;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var7 = p_Var4;
  }
  __assert_fail("forward_ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0x11b,"void GcHeap::GcHeapImpl::Collect()");
}

Assistant:

void Collect() {
#ifdef DEBUG
    if (heap_verify) {
      VerifyHeap();
    }
#endif

    gc_number++;
    DebugLog("[%d] beginning a GC", gc_number);
    assert(forwarding_addresses.empty());
    assert(worklist.empty());
    // flip the fromspace and tospace - we're about
    // to relocate all of our live objects to the new tospace.
    Flip();

    // all roots are known to be live. we'll process those first.
    DebugLog("[%d] processing roots", gc_number);
    ScanRoots([&](Sexp **ptr) { Process(ptr); });

    // we've populated our worklist, now we need to process it.
    DebugLog("[%d] draining worklist", gc_number);
    while (!worklist.empty()) {
      Sexp *ptr = worklist.back();
      worklist.pop_back();
      // this pointer has already been relocated - we have to
      // process its transitive closure now.
      ptr->TracePointers([&](Sexp **ref) {
        uint8_t *candidate = (uint8_t *)*ref;
        if (candidate >= tospace && candidate < top) {
          // if this pointer points into tospace, that means
          // we've already relocated it and updated the pointer
          // in this object. we don't need to process it again.
          // in fact, we /can't/ process it again, because if we
          // do, it'll get moved to some other garbage location.
          return;
        }

        Process(ref);
      });
    }

    DebugLog("[%d] finalizing dead objects", gc_number);

    finalize_queue.remove_if([&](Sexp *ptr) {
      // check and see if this pointer got relocated. If it
      // did, it has an entry in the forwarding address table.
      if (forwarding_addresses.find(ptr) == forwarding_addresses.end()) {
        // this is correct because, since the object did not relocate,
        // it's still safe to refer to this object by its fromspace pointer.
        DebugLog("[%d] finalizing object %p", gc_number, ptr);
        ptr->Finalize();
        return true;
      }

      // if the object did relocate, it's still live.
      return false;
    });

    DebugLog("[%d] updating pointers in finalizer queue", gc_number);
    // for everything still live in the finalizer queue, we have to
    // update it to point to its relocated location.
    for (auto it = finalize_queue.begin(); it != finalize_queue.end();) {
      Sexp *forward_ptr = forwarding_addresses[*it];
      assert(forward_ptr != nullptr);
      DebugLog("[%d] finalizer queue relocation: %p -> %p", gc_number, *it,
               forward_ptr);
      it = finalize_queue.erase(it);
      finalize_queue.insert(it, forward_ptr);
    }

    DebugLog("[%d] GC complete", gc_number);
    // and we're done!
    forwarding_addresses.clear();
    worklist.clear();

#ifdef DEBUG
    if (heap_verify) {
      VerifyHeap();
    }
#endif
  }